

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_test.cpp
# Opt level: O3

int main(void)

{
  directory_entry *__p;
  directory_entry *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  char cVar4;
  value_type *__x;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  long lVar6;
  directory_entry *m;
  directory_iterator __begin1;
  directory_iterator i;
  path local_70;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  local_48;
  directory_iterator local_30;
  
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_30,&local_70,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_70);
  local_48.
  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (directory_entry *)0x0;
  local_48.
  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (directory_entry *)0x0;
  local_48.
  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_30._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_70._M_pathname._M_dataplus._M_p = (pointer)local_30._M_dir._M_ptr;
    local_70._M_pathname._M_string_length = 0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_30._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_30._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
      local_70._M_pathname._M_dataplus._M_p = (pointer)local_30._M_dir._M_ptr;
      local_70._M_pathname._M_string_length = (size_type)local_30._M_dir._M_refcount._M_pi;
      if (local_30._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_00102718;
    }
    else {
      *(int *)(local_30._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_30._M_dir._M_refcount._M_pi + 8) + 1;
    }
    local_70._M_pathname._M_dataplus._M_p = (pointer)local_30._M_dir._M_ptr;
    local_70._M_pathname._M_string_length = (size_type)local_30._M_dir._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_30._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_30._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_30._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_30._M_dir._M_refcount._M_pi + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_dir._M_refcount._M_pi)
    ;
  }
LAB_00102718:
  while (pdVar3 = local_48.
                  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        pdVar2 = local_48.
                 super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_pathname._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __x = (value_type *)
          std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)&local_70);
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::push_back(&local_48,__x);
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&local_70);
  }
  __p = local_48.
        super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pdVar1 = local_48.
           super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = ((long)local_48.
                   super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>,_std::filesystem::__cxx11::directory_entry>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>,_std::filesystem::__cxx11::directory_entry>
                         *)&local_70,
                        (__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
                         )local_48.
                          super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    if (local_70._M_pathname.field_2._M_allocated_capacity == 0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pdVar2,pdVar3);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,std::filesystem::__cxx11::directory_entry*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pdVar2,pdVar3,local_70._M_pathname.field_2._M_allocated_capacity,
                 local_70._M_pathname._M_string_length);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>,_std::filesystem::__cxx11::directory_entry>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>,_std::filesystem::__cxx11::directory_entry>
                *)&local_70);
    __p = local_48.
          super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pdVar1 = local_48.
             super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pdVar2 = local_48.
                  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      __p != local_48.
             super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish; __p = __p + 1) {
    local_48.
    super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pdVar1;
    pbVar5 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&__p->_M_path);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
    std::ostream::put((char)pbVar5);
    std::ostream::flush();
    pdVar1 = local_48.
             super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pdVar2;
  }
  local_48.
  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = pdVar1;
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_70,(char (*) [9])"./data/0",auto_format);
  cVar4 = std::filesystem::status(&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  if ((cVar4 == -1) || (cVar4 == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"NMSL:",5);
  }
  std::
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ::~vector(&local_48);
  if (local_30._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_dir._M_refcount._M_pi)
    ;
  }
  return 0;
}

Assistant:

int main() {
    auto i = directory_iterator(current_path());
    auto v = vector<directory_entry>{};
    for (auto &e:i) {
        v.push_back(e);
    }
    stable_sort(v.begin(), v.end());
    for (auto &m:v) {
        cout << m << endl;
    }
    if (!exists("./data/0")) {
        cout << "NMSL:";
    }
}